

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall State::update(State *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  float *pfVar6;
  size_type sVar7;
  reference c0_00;
  ulong uVar8;
  reference c1_00;
  int iVar9;
  float *in_RDI;
  __normal_iterator<Ball_*,_std::vector<Ball,_std::allocator<Ball>_>_> *this_00;
  reference pvVar10;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float extraout_XMM0_Da_05;
  float fVar18;
  double dVar19;
  float dt;
  float nv1;
  float nv0;
  float l;
  float vz1;
  float vy1;
  float vx1;
  float vz0;
  float vy0;
  float vx0;
  float p;
  float norm;
  float dvz;
  float dvy;
  float dvx;
  float d;
  float nz;
  float ny;
  float nx;
  float d2;
  value_type *c1;
  int j;
  value_type *c0;
  int i;
  Ball *ball;
  iterator __end1;
  iterator __begin1;
  vector<Ball,_std::allocator<Ball>_> *__range1;
  float energy;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  __normal_iterator<Ball_*,_std::vector<Ball,_std::allocator<Ball>_>_> *in_stack_ffffffffffffff30;
  int local_5c;
  int local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  reference local_30;
  Ball *local_28;
  __normal_iterator<Ball_*,_std::vector<Ball,_std::allocator<Ball>_>_> local_20;
  float *local_18;
  float local_c;
  
  local_c = 0.0;
  local_18 = in_RDI + 4;
  local_20._M_current =
       (Ball *)std::vector<Ball,_std::allocator<Ball>_>::begin
                         ((vector<Ball,_std::allocator<Ball>_> *)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_28 = (Ball *)std::vector<Ball,_std::allocator<Ball>_>::end
                               ((vector<Ball,_std::allocator<Ball>_> *)
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  while (bVar5 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff30,
                            (__normal_iterator<Ball_*,_std::vector<Ball,_std::allocator<Ball>_>_> *)
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)), bVar5) {
    this_00 = &local_20;
    local_30 = __gnu_cxx::__normal_iterator<Ball_*,_std::vector<Ball,_std::allocator<Ball>_>_>::
               operator*(this_00);
    iVar9 = (int)this_00;
    local_30->x = local_30->vx * in_RDI[1] + local_30->x;
    local_30->y = local_30->vy * in_RDI[1] + local_30->y;
    local_30->z = local_30->vz * in_RDI[1] + local_30->z;
    if (local_30->x - local_30->r < -1.0) {
      std::abs(iVar9);
      local_30->vx = extraout_XMM0_Da;
    }
    if (local_30->y - local_30->r < -1.0) {
      std::abs(iVar9);
      local_30->vy = extraout_XMM0_Da_00;
    }
    if (local_30->z - local_30->r < -1.0) {
      std::abs(iVar9);
      local_30->vz = extraout_XMM0_Da_01;
    }
    if (1.0 < local_30->x + local_30->r) {
      std::abs(iVar9);
      local_30->vx = -extraout_XMM0_Da_02;
    }
    if (1.0 < local_30->y + local_30->r) {
      std::abs(iVar9);
      local_30->vy = -extraout_XMM0_Da_03;
    }
    if (1.0 < local_30->z + local_30->r) {
      std::abs(iVar9);
      local_30->vz = -extraout_XMM0_Da_04;
    }
    if ((((local_30->x <= -2.0 && local_30->x != -2.0) ||
         (local_30->y <= -2.0 && local_30->y != -2.0)) || (local_30->z <= 2.0 && local_30->z != 2.0)
        ) || (((2.0 < local_30->x || (2.0 < local_30->y)) || (2.0 < local_30->z)))) {
      local_34 = -1.0;
      pfVar6 = std::max<float>(&local_30->x,&local_34);
      local_30->x = *pfVar6;
      local_38 = 1.0;
      pfVar6 = std::min<float>(&local_30->x,&local_38);
      local_30->x = *pfVar6;
      local_3c = -1.0;
      pfVar6 = std::max<float>(&local_30->y,&local_3c);
      local_30->y = *pfVar6;
      local_40 = 1.0;
      pfVar6 = std::min<float>(&local_30->y,&local_40);
      local_30->y = *pfVar6;
      local_44 = -1.0;
      pfVar6 = std::max<float>(&local_30->z,&local_44);
      local_30->z = *pfVar6;
      local_48 = 1.0;
      pfVar6 = std::min<float>(&local_30->z,&local_48);
      local_30->z = *pfVar6;
    }
    local_c = local_30->m *
              (local_30->vz * local_30->vz +
              local_30->vx * local_30->vx + local_30->vy * local_30->vy) + local_c;
    __gnu_cxx::__normal_iterator<Ball_*,_std::vector<Ball,_std::allocator<Ball>_>_>::operator++
              (&local_20);
  }
  in_RDI[2] = local_c;
  for (local_4c = 0;
      sVar7 = std::vector<Ball,_std::allocator<Ball>_>::size
                        ((vector<Ball,_std::allocator<Ball>_> *)(in_RDI + 4)),
      (ulong)(long)local_4c < sVar7; local_4c = local_4c + 1) {
    c0_00 = std::vector<Ball,_std::allocator<Ball>_>::operator[]
                      ((vector<Ball,_std::allocator<Ball>_> *)(in_RDI + 4),(long)local_4c);
    local_5c = local_4c;
    while( true ) {
      local_5c = local_5c + 1;
      uVar8 = (ulong)local_5c;
      sVar7 = std::vector<Ball,_std::allocator<Ball>_>::size
                        ((vector<Ball,_std::allocator<Ball>_> *)(in_RDI + 4));
      if (sVar7 <= uVar8) break;
      c1_00 = std::vector<Ball,_std::allocator<Ball>_>::operator[]
                        ((vector<Ball,_std::allocator<Ball>_> *)(in_RDI + 4),(long)local_5c);
      pvVar10 = c0_00;
      fVar11 = dist2(c0_00,c1_00);
      iVar9 = (int)pvVar10;
      fVar18 = fVar11;
      fVar12 = dist2(c0_00->r,c1_00->r);
      if (fVar18 <= fVar12) {
        fVar18 = c0_00->x;
        fVar12 = c1_00->x;
        fVar1 = c0_00->y;
        fVar2 = c1_00->y;
        fVar3 = c0_00->z;
        fVar4 = c1_00->z;
        dVar19 = sqrt((double)fVar11);
        fVar13 = (float)dVar19;
        fVar14 = (fVar18 - fVar12) / fVar13;
        fVar15 = (fVar1 - fVar2) / fVar13;
        fVar16 = (fVar3 - fVar4) / fVar13;
        fVar17 = (1.0 / (c0_00->m + c1_00->m)) * 2.0 *
                 ((c0_00->vz - c1_00->vz) * fVar16 +
                 (c0_00->vx - c1_00->vx) * fVar14 + (c0_00->vy - c1_00->vy) * fVar15);
        fVar18 = c1_00->m;
        fVar11 = c1_00->m;
        fVar12 = c1_00->vx;
        fVar1 = c1_00->vy;
        fVar2 = c0_00->m;
        fVar3 = c1_00->vz;
        fVar4 = c0_00->m;
        c0_00->vx = -(c1_00->m * fVar17) * fVar14 + c0_00->vx;
        c0_00->vy = -(fVar18 * fVar17) * fVar15 + c0_00->vy;
        c0_00->vz = -(fVar11 * fVar17) * fVar16 + c0_00->vz;
        c1_00->vx = c0_00->m * fVar17 * fVar14 + fVar12;
        c1_00->vy = fVar2 * fVar17 * fVar15 + fVar1;
        c1_00->vz = fVar4 * fVar17 * fVar16 + fVar3;
        fVar18 = c0_00->r;
        fVar11 = c1_00->r;
        fVar12 = c0_00->vx;
        fVar1 = c0_00->vy;
        fVar2 = c0_00->vz;
        fVar3 = c1_00->vx;
        fVar4 = c1_00->vy;
        fVar17 = c1_00->vz;
        std::abs(iVar9);
        if (1e-05 < extraout_XMM0_Da_05) {
          fVar18 = ((fVar18 + fVar11) * 1.01 + -fVar13) /
                   ((fVar2 * fVar16 + fVar12 * fVar14 + fVar1 * fVar15) -
                   (fVar17 * fVar16 + fVar3 * fVar14 + fVar4 * fVar15));
          c0_00->x = c0_00->vx * fVar18 + c0_00->x;
          c0_00->y = c0_00->vy * fVar18 + c0_00->y;
          c0_00->z = c0_00->vz * fVar18 + c0_00->z;
          c1_00->x = c1_00->vx * fVar18 + c1_00->x;
          c1_00->y = c1_00->vy * fVar18 + c1_00->y;
          c1_00->z = c1_00->vz * fVar18 + c1_00->z;
        }
      }
    }
  }
  *in_RDI = in_RDI[1] + *in_RDI;
  return;
}

Assistant:

void update() {
        float energy = 0.0;

        for (auto & ball : balls) {
            ball.x += ball.vx*dt;
            ball.y += ball.vy*dt;
            ball.z += ball.vz*dt;

            if (ball.x - ball.r < -1.0f) ball.vx =  std::abs(ball.vx);
            if (ball.y - ball.r < -1.0f) ball.vy =  std::abs(ball.vy);
            if (ball.z - ball.r < -1.0f) ball.vz =  std::abs(ball.vz);
            if (ball.x + ball.r >  1.0f) ball.vx = -std::abs(ball.vx);
            if (ball.y + ball.r >  1.0f) ball.vy = -std::abs(ball.vy);
            if (ball.z + ball.r >  1.0f) ball.vz = -std::abs(ball.vz);

            if (ball.x < -2.0f || ball.y < -2.0f || ball.z < 2.0f || ball.x > 2.0f || ball.y > 2.0f || ball.z > 2.0f) {
                ball.x = std::max(ball.x, -1.0f);
                ball.x = std::min(ball.x,  1.0f);
                ball.y = std::max(ball.y, -1.0f);
                ball.y = std::min(ball.y,  1.0f);
                ball.z = std::max(ball.z, -1.0f);
                ball.z = std::min(ball.z,  1.0f);
            }

            energy += ball.m*(ball.vx*ball.vx + ball.vy*ball.vy + ball.vz*ball.vz);
        }

        this->energy = energy;

        for (int i = 0; i < balls.size(); ++i) {
            auto & c0 = balls[i];
            for (int j = i + 1; j < balls.size(); ++j) {
                auto & c1 = balls[j];

                float d2 = ::dist2(c0, c1);
                if (d2 > ::dist2(c0.r, c1.r)) continue;

                float nx = c0.x - c1.x;
                float ny = c0.y - c1.y;
                float nz = c0.z - c1.z;
                float d = sqrt(d2);
                nx /= d;
                ny /= d;
                nz /= d;

                float dvx = c0.vx - c1.vx;
                float dvy = c0.vy - c1.vy;
                float dvz = c0.vz - c1.vz;
                float norm = 1.0f/(c0.m + c1.m);

                float p = 2.0f*norm*(dvx*nx + dvy*ny + dvz*nz);
                float vx0 = c0.vx - c1.m*p*nx;
                float vy0 = c0.vy - c1.m*p*ny;
                float vz0 = c0.vz - c1.m*p*nz;
                float vx1 = c1.vx + c0.m*p*nx;
                float vy1 = c1.vy + c0.m*p*ny;
                float vz1 = c1.vz + c0.m*p*nz;

                c0.vx = vx0;
                c0.vy = vy0;
                c0.vz = vz0;
                c1.vx = vx1;
                c1.vy = vy1;
                c1.vz = vz1;

                float l = 1.01f*(c0.r + c1.r) - d;

                float nv0 = c0.vx*nx + c0.vy*ny + c0.vz*nz;
                float nv1 = c1.vx*nx + c1.vy*ny + c1.vz*nz;
                if (std::abs(nv0 - nv1) > 1e-5) {
                    float dt = l/(nv0 - nv1);

                    c0.x += c0.vx*dt;
                    c0.y += c0.vy*dt;
                    c0.z += c0.vz*dt;
                    c1.x += c1.vx*dt;
                    c1.y += c1.vy*dt;
                    c1.z += c1.vz*dt;
                }
            }
        }

        this->t += dt;
    }